

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O0

void sptk::world::cdft(int n,int isgn,double *a,int *ip,double *w)

{
  double *in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  int *in_R8;
  int nw;
  int n_00;
  
  n_00 = (int)((ulong)in_RDX >> 0x20);
  if (in_ESI < 0) {
    cftbsub(n_00,in_RCX,in_R8,*(int *)in_RCX,(double *)0x123d97);
  }
  else {
    cftfsub(n_00,in_RCX,in_R8,*(int *)in_RCX,(double *)0x123d79);
  }
  return;
}

Assistant:

void cdft(int n, int isgn, double *a, int *ip, double *w) {
#if 0
  void cftfsub(int n, double *a, int *ip, int nw, double *w);
  void cftbsub(int n, double *a, int *ip, int nw, double *w);
#endif
  int nw;

  nw = ip[0];
  if (isgn >= 0) {
    cftfsub(n, a, ip, nw, w);
  } else {
    cftbsub(n, a, ip, nw, w);
  }
}